

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.cpp
# Opt level: O2

void __thiscall antlr::TreeParser::traceOut(TreeParser *this,char *rname,RefAST *t)

{
  AST *pAVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  char *local_40 [4];
  
  (*this->_vptr_TreeParser[0xc])();
  poVar3 = std::operator<<((ostream *)&std::cout,"< ");
  poVar3 = std::operator<<(poVar3,rname);
  poVar3 = std::operator<<(poVar3,"(");
  bVar2 = true;
  pcVar4 = "null";
  if ((t->ref != (ASTRef *)0x0) && (pAVar1 = t->ref->ptr, pAVar1 != (AST *)0x0)) {
    (*pAVar1->_vptr_AST[0x18])(local_40,pAVar1);
    bVar2 = false;
    pcVar4 = local_40[0];
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,")");
  pcVar4 = "";
  if (0 < ((this->inputState).ref)->ptr->guessing) {
    pcVar4 = " [guessing]";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  if (!bVar2) {
    std::__cxx11::string::~string((string *)local_40);
  }
  this->traceDepth = this->traceDepth + -1;
  return;
}

Assistant:

void TreeParser::traceOut(const char* rname, RefAST t)
{
	traceIndent();

	ANTLR_USE_NAMESPACE(std)cout << "< " << rname
			<< "(" << (t ? t->toString().c_str() : "null") << ")"
			<< ((inputState->guessing>0)?" [guessing]":"")
			<< ANTLR_USE_NAMESPACE(std)endl;

	traceDepth--;
}